

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)111,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  Ea<(moira::Mode)3,_1> src;
  u32 local_14;
  ushort local_10;
  
  local_10 = op & 7;
  local_14 = *addr;
  cVar3 = 's';
  lVar2 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "smi"[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_1> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src;
}